

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::crate::CrateReader::ReadTimeSamples(CrateReader *this,TimeSamples *d)

{
  double t;
  int64_t this_00;
  bool bVar1;
  ostream *poVar2;
  value_type *__x;
  size_type sVar3;
  reference pvVar4;
  Value *v;
  string local_1688;
  ostringstream local_1668 [8];
  ostringstream ss_e_12;
  string local_14f0;
  ostringstream local_14d0 [8];
  ostringstream ss_e_11;
  undefined1 local_1358 [8];
  CrateValue value;
  uint64_t next_vrep_loc;
  ostringstream local_1318 [8];
  ostringstream ss_e_10;
  ValueRep local_11a0;
  ValueRep rep;
  size_t i;
  ostringstream local_1170 [8];
  ostringstream ss_e_9;
  string local_ff8;
  ostringstream local_fd8 [8];
  ostringstream ss_e_8;
  uint64_t local_e60;
  uint64_t num_values;
  string local_e38;
  string local_e18 [32];
  ostringstream local_df8 [8];
  ostringstream ss_e_7;
  string local_c80;
  ostringstream local_c60 [8];
  ostringstream ss_e_6;
  string local_ae8;
  ostringstream local_ac8 [8];
  ostringstream ss_e_5;
  string local_950;
  string local_930;
  allocator local_909;
  string local_908 [32];
  fmt local_8e8 [32];
  ostringstream local_8c8 [8];
  ostringstream ss_e_4;
  optional<std::vector<double,_std::allocator<double>_>_> local_750;
  undefined1 local_730 [8];
  optional<std::vector<double,_std::allocator<double>_>_> pv;
  vector<double,_std::allocator<double>_> times;
  string local_6f0;
  ostringstream local_6d0 [8];
  ostringstream ss_e_3;
  undefined1 local_558 [8];
  CrateValue times_value;
  uint64_t values_offset;
  ostringstream local_518 [8];
  ostringstream ss_e_2;
  ValueRep local_3a0;
  ValueRep times_rep;
  string local_378;
  string local_358 [32];
  ostringstream local_338 [8];
  ostringstream ss_e_1;
  string local_1c0;
  ostringstream local_1a0 [8];
  ostringstream ss_e;
  int64_t local_28;
  int64_t offset;
  TimeSamples *d_local;
  CrateReader *this_local;
  
  local_28 = 0;
  offset = (int64_t)d;
  d_local = (TimeSamples *)this;
  bVar1 = StreamReader::read8(this->_sr,&local_28);
  if (bVar1) {
    bVar1 = StreamReader::seek_from_current(this->_sr,local_28 + -8);
    if (bVar1) {
      memset(&local_3a0,0,8);
      bVar1 = ReadValueRep(this,&local_3a0);
      if (bVar1) {
        times_value.value_.v_.vtable = (vtable_type *)StreamReader::tell(this->_sr);
        CrateValue::CrateValue((CrateValue *)local_558);
        bVar1 = UnpackValueRep(this,&local_3a0,(CrateValue *)local_558);
        if (bVar1) {
          ::std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)((long)&pv.contained + 0x10));
          CrateValue::get_value<std::vector<double,std::allocator<double>>>
                    (&local_750,(CrateValue *)local_558);
          nonstd::optional_lite::optional<std::vector<double,_std::allocator<double>_>_>::
          optional<std::vector<double,_std::allocator<double>_>,_0>
                    ((optional<std::vector<double,_std::allocator<double>_>_> *)local_730,&local_750
                    );
          nonstd::optional_lite::optional<std::vector<double,_std::allocator<double>_>_>::~optional
                    (&local_750);
          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_730);
          if (bVar1) {
            __x = nonstd::optional_lite::optional<std::vector<double,_std::allocator<double>_>_>::
                  value((optional<std::vector<double,_std::allocator<double>_>_> *)local_730);
            ::std::vector<double,_std::allocator<double>_>::operator=
                      ((vector<double,_std::allocator<double>_> *)((long)&pv.contained + 0x10),__x);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_8c8);
            poVar2 = ::std::operator<<((ostream *)local_8c8,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,"[Crate]");
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ReadTimeSamples");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x362);
            ::std::operator<<(poVar2," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_908,"`times` in TimeSamples must be type `double[]`, but got type `{}`"
                       ,&local_909);
            CrateValue::type_name_abi_cxx11_(&local_930,(CrateValue *)local_558);
            fmt::format<std::__cxx11::string>
                      (local_8e8,(string *)local_908,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_930);
            poVar2 = ::std::operator<<((ostream *)local_8c8,(string *)local_8e8);
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::string::~string((string *)local_8e8);
            ::std::__cxx11::string::~string((string *)&local_930);
            ::std::__cxx11::string::~string(local_908);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_909);
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_950);
            ::std::__cxx11::string::~string((string *)&local_950);
            this_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_8c8);
          }
          nonstd::optional_lite::optional<std::vector<double,_std::allocator<double>_>_>::~optional
                    ((optional<std::vector<double,_std::allocator<double>_>_> *)local_730);
          if (bVar1) {
            bVar1 = StreamReader::seek_set(this->_sr,(uint64_t)times_value.value_.v_.vtable);
            if (bVar1) {
              bVar1 = StreamReader::read8(this->_sr,&local_28);
              if (bVar1) {
                bVar1 = StreamReader::seek_from_current(this->_sr,local_28 + -8);
                if (bVar1) {
                  local_e60 = 0;
                  bVar1 = StreamReader::read8(this->_sr,&local_e60);
                  if (bVar1) {
                    sVar3 = ::std::vector<double,_std::allocator<double>_>::size
                                      ((vector<double,_std::allocator<double>_> *)
                                       ((long)&pv.contained + 0x10));
                    if (sVar3 == local_e60) {
                      for (rep.data = 0; rep.data < local_e60; rep.data = rep.data + 1) {
                        bVar1 = ReadValueRep(this,&local_11a0);
                        if (!bVar1) {
                          ::std::__cxx11::ostringstream::ostringstream(local_1318);
                          poVar2 = ::std::operator<<((ostream *)local_1318,"[error]");
                          poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                          poVar2 = ::std::operator<<(poVar2,"[Crate]");
                          poVar2 = ::std::operator<<(poVar2,":");
                          poVar2 = ::std::operator<<(poVar2,"ReadTimeSamples");
                          poVar2 = ::std::operator<<(poVar2,"():");
                          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x38d);
                          ::std::operator<<(poVar2," ");
                          poVar2 = ::std::operator<<((ostream *)local_1318,
                                                                                                          
                                                  "Failed to read ValueRep for TimeSample\' value element."
                                                  );
                          ::std::operator<<(poVar2,"\n");
                          ::std::__cxx11::ostringstream::str();
                          PushError(this,(string *)&next_vrep_loc);
                          ::std::__cxx11::string::~string((string *)&next_vrep_loc);
                          this_local._7_1_ = 0;
                          ::std::__cxx11::ostringstream::~ostringstream(local_1318);
                          goto LAB_0023097c;
                        }
                        value.value_.v_.vtable = (vtable_type *)StreamReader::tell(this->_sr);
                        CrateValue::CrateValue((CrateValue *)local_1358);
                        bVar1 = UnpackValueRep(this,&local_11a0,(CrateValue *)local_1358);
                        this_00 = offset;
                        if (bVar1) {
                          pvVar4 = ::std::vector<double,_std::allocator<double>_>::operator[]
                                             ((vector<double,_std::allocator<double>_> *)
                                              ((long)&pv.contained + 0x10),rep.data);
                          t = *pvVar4;
                          v = CrateValue::get_raw((CrateValue *)local_1358);
                          tinyusdz::value::TimeSamples::add_sample((TimeSamples *)this_00,t,v);
                          StreamReader::seek_set(this->_sr,(uint64_t)value.value_.v_.vtable);
                        }
                        else {
                          ::std::__cxx11::ostringstream::ostringstream(local_14d0);
                          poVar2 = ::std::operator<<((ostream *)local_14d0,"[error]");
                          poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                          poVar2 = ::std::operator<<(poVar2,"[Crate]");
                          poVar2 = ::std::operator<<(poVar2,":");
                          poVar2 = ::std::operator<<(poVar2,"ReadTimeSamples");
                          poVar2 = ::std::operator<<(poVar2,"():");
                          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x397);
                          ::std::operator<<(poVar2," ");
                          poVar2 = ::std::operator<<((ostream *)local_14d0,
                                                                                                          
                                                  "Failed to unpack value of TimeSample\'s value element."
                                                  );
                          ::std::operator<<(poVar2,"\n");
                          ::std::__cxx11::ostringstream::str();
                          PushError(this,&local_14f0);
                          ::std::__cxx11::string::~string((string *)&local_14f0);
                          this_local._7_1_ = 0;
                          ::std::__cxx11::ostringstream::~ostringstream(local_14d0);
                        }
                        CrateValue::~CrateValue((CrateValue *)local_1358);
                        if (!bVar1) goto LAB_0023097c;
                      }
                      StreamReader::seek_set(this->_sr,(uint64_t)times_value.value_.v_.vtable);
                      bVar1 = StreamReader::seek_from_current(this->_sr,local_e60 << 3);
                      if (bVar1) {
                        this_local._7_1_ = 1;
                      }
                      else {
                        ::std::__cxx11::ostringstream::ostringstream(local_1668);
                        poVar2 = ::std::operator<<((ostream *)local_1668,"[error]");
                        poVar2 = ::std::operator<<(poVar2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                  );
                        poVar2 = ::std::operator<<(poVar2,"[Crate]");
                        poVar2 = ::std::operator<<(poVar2,":");
                        poVar2 = ::std::operator<<(poVar2,"ReadTimeSamples");
                        poVar2 = ::std::operator<<(poVar2,"():");
                        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x3a5);
                        ::std::operator<<(poVar2," ");
                        poVar2 = ::std::operator<<((ostream *)local_1668,
                                                   "Failed to seek over TimeSamples\'s values.");
                        ::std::operator<<(poVar2,"\n");
                        ::std::__cxx11::ostringstream::str();
                        PushError(this,&local_1688);
                        ::std::__cxx11::string::~string((string *)&local_1688);
                        this_local._7_1_ = 0;
                        ::std::__cxx11::ostringstream::~ostringstream(local_1668);
                      }
                    }
                    else {
                      ::std::__cxx11::ostringstream::ostringstream(local_1170);
                      poVar2 = ::std::operator<<((ostream *)local_1170,"[error]");
                      poVar2 = ::std::operator<<(poVar2,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                );
                      poVar2 = ::std::operator<<(poVar2,"[Crate]");
                      poVar2 = ::std::operator<<(poVar2,":");
                      poVar2 = ::std::operator<<(poVar2,"ReadTimeSamples");
                      poVar2 = ::std::operator<<(poVar2,"():");
                      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x386);
                      ::std::operator<<(poVar2," ");
                      poVar2 = ::std::operator<<((ostream *)local_1170,
                                                 "# of `times` elements and # of values in Crate differs."
                                                );
                      ::std::operator<<(poVar2,"\n");
                      ::std::__cxx11::ostringstream::str();
                      PushError(this,(string *)&i);
                      ::std::__cxx11::string::~string((string *)&i);
                      this_local._7_1_ = 0;
                      ::std::__cxx11::ostringstream::~ostringstream(local_1170);
                    }
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream(local_fd8);
                    poVar2 = ::std::operator<<((ostream *)local_fd8,"[error]");
                    poVar2 = ::std::operator<<(poVar2,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                              );
                    poVar2 = ::std::operator<<(poVar2,"[Crate]");
                    poVar2 = ::std::operator<<(poVar2,":");
                    poVar2 = ::std::operator<<(poVar2,"ReadTimeSamples");
                    poVar2 = ::std::operator<<(poVar2,"():");
                    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x37f);
                    ::std::operator<<(poVar2," ");
                    poVar2 = ::std::operator<<((ostream *)local_fd8,
                                               "Failed to read the number of values from TimeSamples."
                                              );
                    ::std::operator<<(poVar2,"\n");
                    ::std::__cxx11::ostringstream::str();
                    PushError(this,&local_ff8);
                    ::std::__cxx11::string::~string((string *)&local_ff8);
                    this_local._7_1_ = 0;
                    ::std::__cxx11::ostringstream::~ostringstream(local_fd8);
                  }
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_df8);
                  poVar2 = ::std::operator<<((ostream *)local_df8,"[error]");
                  poVar2 = ::std::operator<<(poVar2,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                            );
                  poVar2 = ::std::operator<<(poVar2,"[Crate]");
                  poVar2 = ::std::operator<<(poVar2,":");
                  poVar2 = ::std::operator<<(poVar2,"ReadTimeSamples");
                  poVar2 = ::std::operator<<(poVar2,"():");
                  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x37a);
                  ::std::operator<<(poVar2," ");
                  ::std::__cxx11::to_string(&local_e38,local_28);
                  ::std::operator+((char *)local_e18,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)"Failed to seek to TimeSample values. Invalid offset value: ")
                  ;
                  poVar2 = ::std::operator<<((ostream *)local_df8,local_e18);
                  ::std::operator<<(poVar2,"\n");
                  ::std::__cxx11::string::~string(local_e18);
                  ::std::__cxx11::string::~string((string *)&local_e38);
                  ::std::__cxx11::ostringstream::str();
                  PushError(this,(string *)&num_values);
                  ::std::__cxx11::string::~string((string *)&num_values);
                  this_local._7_1_ = 0;
                  ::std::__cxx11::ostringstream::~ostringstream(local_df8);
                }
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_c60);
                poVar2 = ::std::operator<<((ostream *)local_c60,"[error]");
                poVar2 = ::std::operator<<(poVar2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar2 = ::std::operator<<(poVar2,"[Crate]");
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = ::std::operator<<(poVar2,"ReadTimeSamples");
                poVar2 = ::std::operator<<(poVar2,"():");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x371);
                ::std::operator<<(poVar2," ");
                poVar2 = ::std::operator<<((ostream *)local_c60,
                                           "Failed to read the offset for value in TimeSamples.");
                ::std::operator<<(poVar2,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_c80);
                ::std::__cxx11::string::~string((string *)&local_c80);
                this_local._7_1_ = 0;
                ::std::__cxx11::ostringstream::~ostringstream(local_c60);
              }
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_ac8);
              poVar2 = ::std::operator<<((ostream *)local_ac8,"[error]");
              poVar2 = ::std::operator<<(poVar2,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar2 = ::std::operator<<(poVar2,"[Crate]");
              poVar2 = ::std::operator<<(poVar2,":");
              poVar2 = ::std::operator<<(poVar2,"ReadTimeSamples");
              poVar2 = ::std::operator<<(poVar2,"():");
              poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x36b);
              ::std::operator<<(poVar2," ");
              poVar2 = ::std::operator<<((ostream *)local_ac8,
                                         "Failed to seek to TimeSamples values.");
              ::std::operator<<(poVar2,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,&local_ae8);
              ::std::__cxx11::string::~string((string *)&local_ae8);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_ac8);
            }
          }
LAB_0023097c:
          ::std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)((long)&pv.contained + 0x10));
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_6d0);
          poVar2 = ::std::operator<<((ostream *)local_6d0,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,"[Crate]");
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ReadTimeSamples");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x357);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)local_6d0,
                                     "Failed to unpack value of TimeSample\'s `times` element.");
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_6f0);
          ::std::__cxx11::string::~string((string *)&local_6f0);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_6d0);
        }
        CrateValue::~CrateValue((CrateValue *)local_558);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_518);
        poVar2 = ::std::operator<<((ostream *)local_518,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[Crate]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReadTimeSamples");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x344);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_518,
                                   "Failed to read ValueRep for TimeSample\' `times` element.");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&values_offset);
        ::std::__cxx11::string::~string((string *)&values_offset);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_518);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_338);
      poVar2 = ::std::operator<<((ostream *)local_338,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[Crate]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadTimeSamples");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x33d);
      ::std::operator<<(poVar2," ");
      ::std::__cxx11::to_string(&local_378,local_28);
      ::std::operator+((char *)local_358,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Failed to seek to TimeSample times. Invalid offset value: ");
      poVar2 = ::std::operator<<((ostream *)local_338,local_358);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string(local_358);
      ::std::__cxx11::string::~string((string *)&local_378);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)&times_rep);
      ::std::__cxx11::string::~string((string *)&times_rep);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_338);
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = ::std::operator<<((ostream *)local_1a0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,"[Crate]");
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadTimeSamples");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x333);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1a0,
                               "Failed to read the offset for value in Dictionary.");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_1c0);
    ::std::__cxx11::string::~string((string *)&local_1c0);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadTimeSamples(value::TimeSamples *d) {

  // Layout
  //
  // - `times`(double[])
  // - NumValueReps(int64)
  // - ArrayOfValueRep
  //

  // TODO(syoyo): Deferred loading of TimeSamples?(See USD's implementation for details)

  DCOUT("ReadTimeSamples: offt before tell = " << _sr->tell());

  // 8byte for the offset for recursive value. See RecursiveRead() in
  // https://github.com/PixarAnimationStudios/USD/blob/release/pxr/usd/usd/crateFile.cpp for details.
  int64_t offset{0};
  if (!_sr->read8(&offset)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the offset for value in Dictionary.");
    return false;
  }

  DCOUT("TimeSample times value offset = " << offset);
  DCOUT("TimeSample tell = " << _sr->tell());

  // -8 to compensate sizeof(offset)
  if (!_sr->seek_from_current(offset - 8)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to seek to TimeSample times. Invalid offset value: " +
            std::to_string(offset));
  }

  // TODO(syoyo): Deduplicate times?

  crate::ValueRep times_rep{0};
  if (!ReadValueRep(&times_rep)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read ValueRep for TimeSample' `times` element.");
  }

  // Save offset
  auto values_offset = _sr->tell();

  // TODO: Enable Check if  type `double[]`
#if 0
  if (times_rep.GetType() == crate::CrateDataTypeId::CRATE_DATA_TYPE_DOUBLE_VECTOR) {
    // ok
  } else if ((times_rep.GetType() == crate::CrateDataTypeId::CRATE_DATA_TYPE_DOUBOLE) && times_rep.IsArray()) {
    // ok
  } else {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("`times` value must be type `double[]`, but got type `{}`", times_rep.GetTypeName()));
  }
#endif

  crate::CrateValue times_value;
  if (!UnpackValueRep(times_rep, &times_value)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to unpack value of TimeSample's `times` element.");
  }

  // must be an array of double.
  DCOUT("TimeSample times:" << times_value.type_name());

  std::vector<double> times;
  if (auto pv = times_value.get_value<std::vector<double>>()) {
    times = pv.value();
    DCOUT("`times` = " << times);
  } else {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("`times` in TimeSamples must be type `double[]`, but got type `{}`", times_value.type_name()));
  }

  //
  // Parse values(elements) of TimeSamples.
  //

  // seek position will be changed in `_UnpackValueRep`, so revert it.
  if (!_sr->seek_set(values_offset)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to seek to TimeSamples values.");
  }

  // 8byte for the offset for recursive value. See RecursiveRead() in
  // crateFile.cpp for details.
  if (!_sr->read8(&offset)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the offset for value in TimeSamples.");
    return false;
  }

  DCOUT("TimeSample value offset = " << offset);
  DCOUT("TimeSample tell = " << _sr->tell());

  // -8 to compensate sizeof(offset)
  if (!_sr->seek_from_current(offset - 8)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to seek to TimeSample values. Invalid offset value: " + std::to_string(offset));
  }

  uint64_t num_values{0};
  if (!_sr->read8(&num_values)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of values from TimeSamples.");
    return false;
  }

  DCOUT("Number of values = " << num_values);

  if (times.size() != num_values) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "# of `times` elements and # of values in Crate differs.");
  }

  for (size_t i = 0; i < num_values; i++) {

    crate::ValueRep rep;
    if (!ReadValueRep(&rep)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read ValueRep for TimeSample' value element.");
    }

    auto next_vrep_loc = _sr->tell();

    ///
    /// Type check of the content of `value` will be done at ReconstructPrim() in usdc-reader.cc.
    ///
    crate::CrateValue value;
    if (!UnpackValueRep(rep, &value)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to unpack value of TimeSample's value element.");
    }

    d->add_sample(times[i], value.get_raw());

    // UnpackValueRep() will change StreamReader's read position.
    // Revert to next ValueRep location here.
    _sr->seek_set(next_vrep_loc);
  }

  // Move to next location.
  // sizeof(uint64) = sizeof(ValueRep)
  _sr->seek_set(values_offset);
  if (!_sr->seek_from_current(int64_t(sizeof(uint64_t) * num_values))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to seek over TimeSamples's values.");
  }


  return true;
}